

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

SHADING_RATE Diligent::VkFragmentSizeToShadingRate(VkExtent2D *Size)

{
  bool bVar1;
  Uint32 UVar2;
  Uint32 UVar3;
  Char *pCVar4;
  char (*in_RCX) [54];
  undefined1 local_88 [8];
  string msg_2;
  string msg_1;
  uint32_t Y;
  uint32_t X;
  undefined1 local_30 [8];
  string msg;
  VkExtent2D *Size_local;
  
  msg.field_2._8_8_ = Size;
  bVar1 = IsPowerOfTwo<unsigned_int>(Size->width);
  if ((!bVar1) || (bVar1 = IsPowerOfTwo<unsigned_int>(*(uint *)(msg.field_2._8_8_ + 4)), !bVar1)) {
    FormatString<char[26],char[54]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"IsPowerOfTwo(Size.width) && IsPowerOfTwo(Size.height)",in_RCX);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"VkFragmentSizeToShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x77b);
    std::__cxx11::string::~string((string *)local_30);
  }
  UVar2 = LinuxMisc::GetMSB(*(Uint32 *)msg.field_2._8_8_);
  UVar3 = LinuxMisc::GetMSB(*(Uint32 *)(msg.field_2._8_8_ + 4));
  if (1 << ((byte)UVar2 & 0x1f) != *(int *)msg.field_2._8_8_) {
    FormatString<char[26],char[24]>
              ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(1u << X) == Size.width",(char (*) [24])msg.field_2._8_8_);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"VkFragmentSizeToShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x77e);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if (1 << ((SHADING_RATE)UVar3 & 0x1f) != *(int *)(msg.field_2._8_8_ + 4)) {
    FormatString<char[26],char[25]>
              ((string *)local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(1u << Y) == Size.height",(char (*) [25])msg.field_2._8_8_);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"VkFragmentSizeToShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x77f);
    std::__cxx11::string::~string((string *)local_88);
  }
  return (SHADING_RATE)(UVar2 << 2) | (SHADING_RATE)UVar3;
}

Assistant:

SHADING_RATE VkFragmentSizeToShadingRate(const VkExtent2D& Size)
{
    VERIFY_EXPR(IsPowerOfTwo(Size.width) && IsPowerOfTwo(Size.height));
    uint32_t X = PlatformMisc::GetMSB(Size.width);
    uint32_t Y = PlatformMisc::GetMSB(Size.height);
    VERIFY_EXPR((1u << X) == Size.width);
    VERIFY_EXPR((1u << Y) == Size.height);
    return static_cast<SHADING_RATE>((X << SHADING_RATE_X_SHIFT) | Y);
}